

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Clara::Help::Help(Help *this,bool *showHelpFlag)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_b0 [2];
  __allocator_type __a2;
  value_type local_70;
  value_type local_50;
  
  p_Var1 = (pointer)operator_new(0x20);
  local_b0[0]._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002f61d0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_002f6220;
  *(bool **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = showHelpFlag;
  local_b0[0]._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2873:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2873:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(local_b0);
  local_70._M_dataplus._M_p = (pointer)0x0;
  local_70._M_string_length = 0;
  local_b0[0]._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)&p_Var1->_M_impl;
  local_b0[0]._M_ptr = p_Var1;
  Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Opt> *)this,
             (shared_ptr<Catch::Clara::Detail::BoundRef> *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0[0]._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
  (this->super_Opt).m_optNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_002f6e08;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"display usage information",&local_b1);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-?",&local_b2);
  this_00 = &(this->super_Opt).m_optNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&__a2,"-h",&local_b3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)&__a2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"--help",&local_b4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_50);
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&__a2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

Help::Help( bool& showHelpFlag ):
            Opt( [&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            } ) {
            static_cast<Opt&> ( *this )(
                "display usage information" )["-?"]["-h"]["--help"]
                .optional();
        }